

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# maths.c
# Opt level: O2

void vec4_normalize_this(vec4 v)

{
  return;
}

Assistant:

void vec4_normalize_this(vec4 v) {
    float l = sqrtf(v.x * v.x + v.y * v.y + v.z * v.z + v.w * v.w);
    if (l != 0) {
        v.x /= l;
        v.y /= l;
        v.z /= l;
        v.w /= l;
    }
}